

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol.cpp
# Opt level: O1

int32_t ucol_mergeSortkeys_63
                  (uint8_t *src1,int32_t src1Length,uint8_t *src2,int32_t src2Length,uint8_t *dest,
                  int32_t destCapacity)

{
  byte *pbVar1;
  byte bVar2;
  size_t sVar3;
  byte *pbVar4;
  long lVar5;
  
  if (((src1Length != 0) && (src1 != (uint8_t *)0x0)) && (-2 < src1Length)) {
    if (src1Length < 1) {
      if (src2 == (uint8_t *)0x0) goto LAB_002842b0;
    }
    else if ((src2 == (uint8_t *)0x0) || (src1[(ulong)(uint)src1Length - 1] != '\0'))
    goto LAB_002842b0;
    if (src2Length != 0 && -2 < src2Length) {
      if (src2Length < 1) {
        if (destCapacity < 0) goto LAB_002842b0;
      }
      else if ((destCapacity < 0) || (src2[(ulong)(uint)src2Length - 1] != '\0')) goto LAB_002842b0;
      if (dest != (uint8_t *)0x0 || destCapacity < 1) {
        if (src1Length < 0) {
          sVar3 = strlen((char *)src1);
          src1Length = (int)sVar3 + 1;
        }
        if (src2Length < 0) {
          sVar3 = strlen((char *)src2);
          src2Length = (int)sVar3 + 1;
        }
        pbVar4 = dest;
        if (destCapacity < src2Length + src1Length) {
          return src2Length + src1Length;
        }
        while( true ) {
          bVar2 = *src1;
          while (1 < bVar2) {
            *pbVar4 = bVar2;
            pbVar4 = pbVar4 + 1;
            pbVar1 = src1 + 1;
            src1 = src1 + 1;
            bVar2 = *pbVar1;
          }
          *pbVar4 = 2;
          bVar2 = *src2;
          while (pbVar1 = pbVar4 + 1, 1 < bVar2) {
            *pbVar1 = bVar2;
            pbVar4 = src2 + 1;
            src2 = src2 + 1;
            bVar2 = *pbVar4;
            pbVar4 = pbVar1;
          }
          if (bVar2 == 0 || *src1 != 1) break;
          src1 = src1 + 1;
          src2 = src2 + 1;
          *pbVar1 = 1;
          pbVar4 = pbVar4 + 2;
        }
        if (*src1 != 0) {
          src2 = src1;
        }
        lVar5 = 0;
        do {
          bVar2 = src2[lVar5];
          pbVar1[lVar5] = bVar2;
          lVar5 = lVar5 + 1;
        } while (bVar2 != 0);
        return (int)lVar5 + ((int)pbVar1 - (int)dest);
      }
    }
  }
LAB_002842b0:
  if (0 < destCapacity && dest != (uint8_t *)0x0) {
    *dest = '\0';
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_mergeSortkeys(const uint8_t *src1, int32_t src1Length,
                   const uint8_t *src2, int32_t src2Length,
                   uint8_t *dest, int32_t destCapacity) {
    /* check arguments */
    if( src1==NULL || src1Length<-1 || src1Length==0 || (src1Length>0 && src1[src1Length-1]!=0) ||
        src2==NULL || src2Length<-1 || src2Length==0 || (src2Length>0 && src2[src2Length-1]!=0) ||
        destCapacity<0 || (destCapacity>0 && dest==NULL)
    ) {
        /* error, attempt to write a zero byte and return 0 */
        if(dest!=NULL && destCapacity>0) {
            *dest=0;
        }
        return 0;
    }

    /* check lengths and capacity */
    if(src1Length<0) {
        src1Length=(int32_t)uprv_strlen((const char *)src1)+1;
    }
    if(src2Length<0) {
        src2Length=(int32_t)uprv_strlen((const char *)src2)+1;
    }

    int32_t destLength=src1Length+src2Length;
    if(destLength>destCapacity) {
        /* the merged sort key does not fit into the destination */
        return destLength;
    }

    /* merge the sort keys with the same number of levels */
    uint8_t *p=dest;
    for(;;) {
        /* copy level from src1 not including 00 or 01 */
        uint8_t b;
        while((b=*src1)>=2) {
            ++src1;
            *p++=b;
        }

        /* add a 02 merge separator */
        *p++=2;

        /* copy level from src2 not including 00 or 01 */
        while((b=*src2)>=2) {
            ++src2;
            *p++=b;
        }

        /* if both sort keys have another level, then add a 01 level separator and continue */
        if(*src1==1 && *src2==1) {
            ++src1;
            ++src2;
            *p++=1;
        } else {
            break;
        }
    }

    /*
     * here, at least one sort key is finished now, but the other one
     * might have some contents left from containing more levels;
     * that contents is just appended to the result
     */
    if(*src1!=0) {
        /* src1 is not finished, therefore *src2==0, and src1 is appended */
        src2=src1;
    }
    /* append src2, "the other, unfinished sort key" */
    while((*p++=*src2++)!=0) {}

    /* the actual length might be less than destLength if either sort key contained illegally embedded zero bytes */
    return (int32_t)(p-dest);
}